

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_generator.cc
# Opt level: O2

string * google::protobuf::compiler::StripProto(string *__return_storage_ptr__,string *filename)

{
  bool bVar1;
  allocator local_61;
  string local_60;
  StringPiece local_40;
  StringPiece local_30;
  
  stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>(&local_30,filename);
  stringpiece_internal::StringPiece::StringPiece(&local_40,".protodevel");
  bVar1 = HasSuffixString(local_30,local_40);
  if (bVar1) {
    std::__cxx11::string::string((string *)&local_60,".protodevel",&local_61);
    StripSuffixString(__return_storage_ptr__,filename,&local_60);
  }
  else {
    std::__cxx11::string::string((string *)&local_60,".proto",&local_61);
    StripSuffixString(__return_storage_ptr__,filename,&local_60);
  }
  std::__cxx11::string::~string((string *)&local_60);
  return __return_storage_ptr__;
}

Assistant:

std::string StripProto(const std::string& filename) {
  if (HasSuffixString(filename, ".protodevel")) {
    return StripSuffixString(filename, ".protodevel");
  } else {
    return StripSuffixString(filename, ".proto");
  }
}